

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

VP8StatusCode IDecode(WebPIDecoder *idec)

{
  VP8Io *pVVar1;
  size_t *psVar2;
  VP8BitReader *token_br;
  VP8BitReader *pVVar3;
  uint8_t **ppuVar4;
  VP8MB VVar5;
  VP8MB VVar6;
  WebPDecBuffer *pWVar7;
  void *pvVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined8 uVar13;
  int iVar14;
  VP8StatusCode VVar15;
  VP8StatusCode VVar16;
  VP8LDecoder *pVVar17;
  size_t sVar18;
  VP8Decoder *pVVar19;
  uint8_t *puVar20;
  WebPWorkerInterface *pWVar21;
  uint uVar22;
  DecState DVar24;
  uint3 *data;
  ulong uVar25;
  size_t sVar26;
  int height;
  int width;
  int local_7c;
  WebPHeaderStructure local_78;
  uint32_t uVar23;
  
  DVar24 = idec->state_;
  if (DVar24 == STATE_WEBP_HEADER) {
    local_78.data_size = (idec->mem_).start_;
    local_78.data = (idec->mem_).buf_ + local_78.data_size;
    local_78.data_size = (idec->mem_).end_ - local_78.data_size;
    local_78.have_all_data = 0;
    VVar15 = WebPParseHeaders(&local_78);
    if (VVar15 == VP8_STATUS_OK) {
      idec->chunk_size_ =
           CONCAT44(local_78.compressed_size._4_4_,(undefined4)local_78.compressed_size);
      idec->is_lossless_ = local_78.is_lossless;
      if (local_78.is_lossless == 0) {
        pVVar19 = VP8New();
        if (pVVar19 == (VP8Decoder *)0x0) goto LAB_00107acd;
        pVVar19->incremental_ = 1;
        idec->dec_ = pVVar19;
        pVVar19->alpha_data_ =
             (uint8_t *)CONCAT44(local_78.alpha_data._4_4_,local_78.alpha_data._0_4_);
        pVVar19->alpha_data_size_ =
             CONCAT44(local_78.alpha_data_size._4_4_,(undefined4)local_78.alpha_data_size);
        sVar26 = (idec->mem_).end_;
        sVar18 = (idec->mem_).start_ + CONCAT44(local_78.offset._4_4_,(undefined4)local_78.offset);
        idec->state_ = STATE_VP8_HEADER;
        (idec->mem_).start_ = sVar18;
        (idec->io_).data = (idec->mem_).buf_ + sVar18;
        (idec->io_).data_size = sVar26 - sVar18;
      }
      else {
        pVVar17 = VP8LNew();
        if (pVVar17 == (VP8LDecoder *)0x0) {
LAB_00107acd:
          VVar16 = VP8_STATUS_OUT_OF_MEMORY;
          goto LAB_00107ad2;
        }
        idec->dec_ = pVVar17;
        sVar26 = (idec->mem_).end_;
        sVar18 = (idec->mem_).start_ + CONCAT44(local_78.offset._4_4_,(undefined4)local_78.offset);
        idec->state_ = STATE_VP8L_HEADER;
        (idec->mem_).start_ = sVar18;
        (idec->io_).data = (idec->mem_).buf_ + sVar18;
        (idec->io_).data_size = sVar26 - sVar18;
      }
      VVar16 = VP8_STATUS_OK;
    }
    else {
      VVar16 = VP8_STATUS_SUSPENDED;
      if (VVar15 != VP8_STATUS_NOT_ENOUGH_DATA) {
        if (idec->state_ == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec_,&idec->io_);
        }
        idec->state_ = STATE_ERROR;
        VVar16 = VVar15;
      }
    }
LAB_00107ad2:
    DVar24 = idec->state_;
  }
  else {
    VVar16 = VP8_STATUS_SUSPENDED;
    if (idec->dec_ == (void *)0x0) {
      return VP8_STATUS_SUSPENDED;
    }
  }
  if (DVar24 == STATE_VP8_HEADER) {
    sVar26 = (idec->mem_).start_;
    uVar25 = (idec->mem_).end_ - sVar26;
    if (uVar25 < 10) {
      VVar16 = VP8_STATUS_SUSPENDED;
      DVar24 = STATE_VP8_HEADER;
    }
    else {
      data = (uint3 *)((idec->mem_).buf_ + sVar26);
      iVar14 = VP8GetInfo((uint8_t *)data,uVar25,idec->chunk_size_,(int *)&local_78,&local_7c);
      if (iVar14 == 0) {
        VVar16 = VP8_STATUS_BITSTREAM_ERROR;
        DVar24 = STATE_ERROR;
        if (idec->state_ == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec_,&idec->io_);
        }
      }
      else {
        (idec->mem_).part0_size_ = (ulong)((*data >> 5) + 10);
        (idec->io_).data = (uint8_t *)data;
        (idec->io_).data_size = uVar25;
        VVar16 = VP8_STATUS_OK;
        DVar24 = STATE_VP8_PARTS0;
      }
      idec->state_ = DVar24;
    }
  }
  if (DVar24 == STATE_VP8_PARTS0) {
    VVar16 = VP8_STATUS_SUSPENDED;
    if ((idec->mem_).part0_size_ <= (idec->mem_).end_ - (idec->mem_).start_) {
      pWVar7 = (idec->params_).output;
      pVVar19 = (VP8Decoder *)idec->dec_;
      pVVar1 = &idec->io_;
      iVar14 = VP8GetHeaders(pVVar19,pVVar1);
      if (iVar14 == 0) {
        VVar15 = pVVar19->status_;
        DVar24 = idec->state_;
        VVar16 = VP8_STATUS_SUSPENDED;
        if ((VVar15 & ~VP8_STATUS_INVALID_PARAM) != VP8_STATUS_SUSPENDED) goto joined_r0x00107f49;
        goto LAB_00107cc9;
      }
      VVar15 = WebPAllocateDecBuffer
                         ((idec->io_).width,(idec->io_).height,(idec->params_).options,pWVar7);
      pVVar19->status_ = VVar15;
      if (VVar15 == VP8_STATUS_OK) {
        iVar14 = VP8GetThreadMethod((idec->params_).options,(WebPHeaderStructure *)0x0,
                                    (idec->io_).width,(idec->io_).height);
        pVVar19->mt_method_ = iVar14;
        VP8InitDithering((idec->params_).options,pVVar19);
        pvVar8 = idec->dec_;
        sVar26 = *(long *)((long)pvVar8 + 0x28) - *(long *)((long)pvVar8 + 0x20);
        if (sVar26 == 0) {
          VVar15 = VP8_STATUS_BITSTREAM_ERROR;
LAB_00107f5a:
          pVVar19->status_ = VVar15;
        }
        else {
          if ((idec->mem_).mode_ == MEM_MODE_APPEND) {
            puVar20 = (uint8_t *)WebPSafeMalloc(1,sVar26);
            if (puVar20 == (uint8_t *)0x0) {
              VVar15 = VP8_STATUS_OUT_OF_MEMORY;
              goto LAB_00107f5a;
            }
            memcpy(puVar20,*(void **)((long)pvVar8 + 0x20),sVar26);
            (idec->mem_).part0_buf_ = puVar20;
            VP8BitReaderSetBuffer((VP8BitReader *)((long)pvVar8 + 0x10),puVar20,sVar26);
          }
          psVar2 = &(idec->mem_).start_;
          *psVar2 = *psVar2 + sVar26;
          pVVar19->status_ = VP8_STATUS_OK;
          VVar15 = VP8EnterCritical(pVVar19,pVVar1);
          if (VVar15 == VP8_STATUS_OK) {
            idec->state_ = STATE_VP8_DATA;
            iVar14 = VP8InitFrame(pVVar19,pVVar1);
            VVar16 = VP8_STATUS_OK;
            DVar24 = idec->state_;
            if (iVar14 == 0) {
              VVar15 = pVVar19->status_;
              goto joined_r0x00107f49;
            }
            goto LAB_00107cc9;
          }
          VVar15 = pVVar19->status_;
        }
      }
      goto LAB_00108090;
    }
  }
  else {
LAB_00107cc9:
    if (DVar24 == STATE_VP8_DATA) {
      pVVar19 = (VP8Decoder *)idec->dec_;
      if (pVVar19 == (VP8Decoder *)0x0) {
        return VP8_STATUS_SUSPENDED;
      }
      pVVar1 = &idec->io_;
      if (pVVar19->ready_ == 0) {
LAB_00107e6e:
        VP8ExitCritical(pVVar19,pVVar1);
LAB_00107e73:
        idec->state_ = STATE_ERROR;
        VVar16 = VP8_STATUS_BITSTREAM_ERROR;
      }
      else {
        iVar14 = pVVar19->mb_y_;
        if (iVar14 < pVVar19->mb_h_) {
          do {
            if (idec->last_mb_y_ != iVar14) {
              iVar14 = VP8ParseIntraModeRow(&pVVar19->br_,pVVar19);
              if (iVar14 == 0) {
                if (idec->state_ == STATE_VP8_DATA) {
                  VP8ExitCritical((VP8Decoder *)idec->dec_,pVVar1);
                }
                idec->state_ = STATE_ERROR;
                return VP8_STATUS_BITSTREAM_ERROR;
              }
              idec->last_mb_y_ = pVVar19->mb_y_;
            }
            iVar14 = pVVar19->mb_x_;
            if (iVar14 < pVVar19->mb_w_) {
              uVar23 = pVVar19->num_parts_minus_one_;
              do {
                uVar22 = uVar23 & pVVar19->mb_y_;
                token_br = pVVar19->parts_ + uVar22;
                VVar5 = pVVar19->mb_info_[-1];
                VVar6 = pVVar19->mb_info_[iVar14];
                pVVar3 = pVVar19->parts_ + uVar22;
                uVar9 = pVVar3->range_;
                uVar10 = pVVar3->bits_;
                ppuVar4 = &pVVar19->parts_[uVar22].buf_;
                puVar20 = *ppuVar4;
                puVar11 = ppuVar4[1];
                ppuVar4 = &pVVar19->parts_[uVar22].buf_max_;
                puVar12 = *ppuVar4;
                uVar13 = ppuVar4[1];
                local_78.alpha_data._4_4_ = SUB84(puVar12,0);
                local_78.alpha_data_size._0_4_ = (undefined4)((ulong)puVar12 >> 0x20);
                local_78.alpha_data_size._4_4_ = (undefined4)uVar13;
                local_78.compressed_size._0_4_ = (undefined4)((ulong)uVar13 >> 0x20);
                local_78._20_4_ = SUB84(puVar20,0);
                local_78.offset._0_4_ = (undefined4)((ulong)puVar20 >> 0x20);
                local_78.offset._4_4_ = SUB84(puVar11,0);
                local_78.alpha_data._0_4_ = (undefined4)((ulong)puVar11 >> 0x20);
                local_78.data._4_4_ = (undefined4)pVVar3->value_;
                local_78.data_size._0_4_ = (undefined4)(pVVar3->value_ >> 0x20);
                local_78.data_size._4_4_ = uVar9;
                local_78.have_all_data = uVar10;
                iVar14 = VP8DecodeMB(pVVar19,token_br);
                uVar23 = pVVar19->num_parts_minus_one_;
                if (iVar14 == 0) {
                  if ((uVar23 != 0) || ((idec->mem_).end_ - (idec->mem_).start_ < 0x1001)) {
                    if (0 < pVVar19->mt_method_) {
                      pWVar21 = WebPGetWorkerInterface();
                      iVar14 = (*pWVar21->Sync)(&pVVar19->worker_);
                      if (iVar14 == 0) goto LAB_00107f09;
                    }
                    pVVar19->mb_info_[-1] = VVar5;
                    pVVar19->mb_info_[pVVar19->mb_x_] = VVar6;
                    token_br->buf_max_ =
                         (uint8_t *)
                         CONCAT44((undefined4)local_78.alpha_data_size,local_78.alpha_data._4_4_);
                    *(ulong *)&token_br->eof_ =
                         CONCAT44((undefined4)local_78.compressed_size,
                                  local_78.alpha_data_size._4_4_);
                    token_br->buf_ =
                         (uint8_t *)CONCAT44((undefined4)local_78.offset,local_78._20_4_);
                    token_br->buf_end_ =
                         (uint8_t *)CONCAT44(local_78.alpha_data._0_4_,local_78.offset._4_4_);
                    token_br->value_ = CONCAT44((undefined4)local_78.data_size,local_78.data._4_4_);
                    token_br->range_ = local_78.data_size._4_4_;
                    token_br->bits_ = local_78.have_all_data;
                    VVar16 = VP8_STATUS_SUSPENDED;
                    goto LAB_00107f82;
                  }
LAB_00107f09:
                  if (idec->state_ != STATE_VP8_DATA) goto LAB_00107e73;
                  pVVar19 = (VP8Decoder *)idec->dec_;
                  goto LAB_00107e6e;
                }
                if (uVar23 == 0) {
                  (idec->mem_).start_ = (long)token_br->buf_ - (long)(idec->mem_).buf_;
                }
                iVar14 = pVVar19->mb_x_ + 1;
                pVVar19->mb_x_ = iVar14;
              } while (iVar14 < pVVar19->mb_w_);
            }
            VP8InitScanline(pVVar19);
            iVar14 = VP8ProcessRow(pVVar19,pVVar1);
            if (iVar14 == 0) {
              if (idec->state_ == STATE_VP8_DATA) {
                VP8ExitCritical((VP8Decoder *)idec->dec_,pVVar1);
              }
              goto LAB_00107f77;
            }
            iVar14 = pVVar19->mb_y_ + 1;
            pVVar19->mb_y_ = iVar14;
          } while (iVar14 < pVVar19->mb_h_);
        }
        iVar14 = VP8ExitCritical(pVVar19,pVVar1);
        if (iVar14 == 0) {
LAB_00107f77:
          idec->state_ = STATE_ERROR;
          VVar16 = VP8_STATUS_USER_ABORT;
        }
        else {
          pVVar19->ready_ = 0;
          VVar16 = FinishDecoding(idec);
        }
      }
LAB_00107f82:
      DVar24 = idec->state_;
    }
    if (DVar24 == STATE_VP8L_HEADER) {
      uVar25 = (idec->mem_).end_ - (idec->mem_).start_;
      pVVar17 = (VP8LDecoder *)idec->dec_;
      if (idec->chunk_size_ >> 3 <= uVar25) {
        pWVar7 = (idec->params_).output;
        iVar14 = VP8LDecodeHeader(pVVar17,&idec->io_);
        if (iVar14 == 0) {
          VVar15 = pVVar17->status_;
          if (VVar15 == VP8_STATUS_BITSTREAM_ERROR) {
            if (uVar25 < idec->chunk_size_) goto LAB_00107fb4;
          }
          else {
            VVar16 = VP8_STATUS_SUSPENDED;
            if ((VVar15 & ~VP8_STATUS_INVALID_PARAM) == VP8_STATUS_SUSPENDED) goto LAB_00107fc1;
          }
        }
        else {
          VVar15 = WebPAllocateDecBuffer
                             ((idec->io_).width,(idec->io_).height,(idec->params_).options,pWVar7);
          pVVar17->status_ = VVar15;
          if (VVar15 == VP8_STATUS_OK) {
            idec->state_ = STATE_VP8L_DATA;
            goto LAB_00107fcd;
          }
        }
LAB_00108090:
        DVar24 = idec->state_;
joined_r0x00107f49:
        if (DVar24 == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec_,&idec->io_);
        }
        idec->state_ = STATE_ERROR;
        return VVar15;
      }
LAB_00107fb4:
      pVVar17->status_ = VP8_STATUS_SUSPENDED;
      VVar16 = VP8_STATUS_SUSPENDED;
    }
  }
LAB_00107fc1:
  if (idec->state_ != STATE_VP8L_DATA) {
    return VVar16;
  }
LAB_00107fcd:
  pVVar17 = (VP8LDecoder *)idec->dec_;
  pVVar17->incremental_ = (uint)((idec->mem_).end_ - (idec->mem_).start_ < idec->chunk_size_);
  iVar14 = VP8LDecodeImage(pVVar17);
  VVar15 = pVVar17->status_;
  if (iVar14 == 0) {
    VVar16 = VP8_STATUS_SUSPENDED;
    if ((VVar15 & ~VP8_STATUS_INVALID_PARAM) != VP8_STATUS_SUSPENDED) {
      if (idec->state_ == STATE_VP8_DATA) {
        VP8ExitCritical((VP8Decoder *)idec->dec_,&idec->io_);
      }
      idec->state_ = STATE_ERROR;
      VVar16 = VVar15;
    }
  }
  else {
    VVar16 = VP8_STATUS_SUSPENDED;
    if (VVar15 != VP8_STATUS_SUSPENDED) {
      VVar16 = FinishDecoding(idec);
    }
  }
  return VVar16;
}

Assistant:

static VP8StatusCode IDecode(WebPIDecoder* idec) {
  VP8StatusCode status = VP8_STATUS_SUSPENDED;

  if (idec->state_ == STATE_WEBP_HEADER) {
    status = DecodeWebPHeaders(idec);
  } else {
    if (idec->dec_ == NULL) {
      return VP8_STATUS_SUSPENDED;    // can't continue if we have no decoder.
    }
  }
  if (idec->state_ == STATE_VP8_HEADER) {
    status = DecodeVP8FrameHeader(idec);
  }
  if (idec->state_ == STATE_VP8_PARTS0) {
    status = DecodePartition0(idec);
  }
  if (idec->state_ == STATE_VP8_DATA) {
    const VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
    if (dec == NULL) {
      return VP8_STATUS_SUSPENDED;  // can't continue if we have no decoder.
    }
    status = DecodeRemaining(idec);
  }
  if (idec->state_ == STATE_VP8L_HEADER) {
    status = DecodeVP8LHeader(idec);
  }
  if (idec->state_ == STATE_VP8L_DATA) {
    status = DecodeVP8LData(idec);
  }
  return status;
}